

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
rebalance_right_to_left
          (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,int to_move,
          btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  slot_type *dest;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar5;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar6;
  template_ElementType<2UL> *ptVar7;
  template_ElementType<2UL> *ptVar8;
  template_ElementType<2UL> *ptVar9;
  template_ElementType<1UL> *ptVar10;
  template_ElementType<3UL> *ppbVar11;
  slot_type *src;
  ulong uVar12;
  long lVar13;
  ulong n;
  template_ElementType<2UL> *local_38;
  
  pbVar5 = parent(this);
  pbVar6 = parent(right);
  if (pbVar5 != pbVar6) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x87f,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x880,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = count(right);
  bVar2 = count(this);
  if (bVar1 < bVar2) {
    __assert_fail("right->count() >= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x881,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if (0 < to_move) {
    bVar1 = count(right);
    if ((uint)bVar1 < (uint)to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x883,
                    "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    bVar1 = count(this);
    pbVar5 = parent(this);
    bVar2 = position(this);
    local_38 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                *)pbVar5);
    local_38 = local_38 + bVar2;
    btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
    value_init<int*>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                      *)this,(ulong)bVar1,alloc,&local_38);
    bVar1 = count(this);
    uninitialized_move_n(right,(ulong)(to_move - 1),0,(ulong)bVar1 + 1,this,alloc);
    ptVar7 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)right);
    pbVar5 = parent(this);
    bVar1 = position(this);
    ptVar8 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)pbVar5);
    ptVar8[bVar1] = ptVar7[to_move - 1];
    n = (ulong)(uint)to_move;
    ptVar7 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)right);
    bVar1 = count(right);
    ptVar8 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)right);
    ptVar9 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                              *)right);
    for (ptVar7 = ptVar7 + n; ptVar7 != ptVar8 + bVar1; ptVar7 = ptVar7 + 1) {
      *ptVar9 = *ptVar7;
      ptVar9 = ptVar9 + 1;
    }
    bVar1 = count(right);
    value_destroy_n(right,(long)(int)((uint)bVar1 - to_move),n,alloc);
    bVar3 = leaf(this);
    if (!bVar3) {
      for (uVar12 = 0; n != uVar12; uVar12 = uVar12 + 1) {
        bVar1 = count(this);
        ppbVar11 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                   ::GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                    *)right);
        init_child(this,(int)uVar12 + (uint)bVar1 + 1,ppbVar11[uVar12]);
      }
      lVar13 = 0;
      while( true ) {
        bVar1 = count(right);
        if ((int)((uint)bVar1 - to_move) < lVar13) break;
        bVar1 = max_count(right);
        if ((int)(uint)bVar1 < to_move + (int)lVar13) {
          __assert_fail("i + to_move <= right->max_count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x89c,
                        "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                       );
        }
        ppbVar11 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                   ::GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                    *)right);
        init_child(right,(int)lVar13,ppbVar11[n + lVar13]);
        btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
        GetField<3ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                       *)right);
        lVar13 = lVar13 + 1;
      }
    }
    fVar4 = count(this);
    ptVar10 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
              ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                               *)this);
    ptVar10[2] = fVar4 + (char)to_move;
    fVar4 = count(right);
    ptVar10 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
              ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                               *)right);
    ptVar10[2] = fVar4 - (char)to_move;
    return;
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x882,
                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(right->count() >= count());
        assert(to_move >= 1);
        assert(to_move <= right->count());

        // 1) Move the delimiting value in the parent to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // 2) Move the (to_move - 1) values from the right node to the left node.
        right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

        // 3) Move the new delimiting value to the parent from the right node.
        params_type::move(alloc, right->slot(to_move - 1),
                          parent()->slot(position()));

        // 4) Shift the values in the right node to their correct position.
        params_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                          right->slot(0));

        // 5) Destroy the now-empty to_move entries in the right node.
        right->value_destroy_n(right->count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i < to_move; ++i) {
                init_child(count() + i + 1, right->child(i));
            }
            for (int i = 0; i <= right->count() - to_move; ++i) {
                assert(i + to_move <= right->max_count());
                right->init_child(i, right->child(i + to_move));
                right->clear_child(i + to_move);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() + to_move));
        right->set_count((field_type)(right->count() - to_move));
    }